

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O0

bool QSystemSemaphore::isKeyTypeSupported(Type type)

{
  long lVar1;
  bool bVar2;
  Type in_DI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffe8;
  undefined1 local_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QtIpcCommon::isIpcSupported(SystemSemaphore,in_DI);
  if (bVar2) {
    local_a = QtIpcCommon::
              IpcStorageVariant<&QSystemSemaphorePrivate::Backend::posix,&QSystemSemaphorePrivate::Backend::sysv,&QSystemSemaphorePrivate::Backend::win32>
              ::staticVisit<QSystemSemaphore::isKeyTypeSupported(QNativeIpcKey::Type)::__0>
                        (in_DI,in_stack_ffffffffffffffe8);
  }
  else {
    local_a = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_a;
  }
  __stack_chk_fail();
}

Assistant:

bool QSystemSemaphore::isKeyTypeSupported(QNativeIpcKey::Type type)
{
    if (!isIpcSupported(IpcType::SystemSemaphore, type))
        return false;
    using Variant = decltype(QSystemSemaphorePrivate::backend);
    return Variant::staticVisit(type, [](auto ptr) {
        using Impl = std::decay_t<decltype(*ptr)>;
        return Impl::runtimeSupportCheck();
    });
}